

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddLanguageFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,cmBuildStep compileOrLink,
          string *lang,string *config)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  bool bVar3;
  cmMakefile *pcVar4;
  string *psVar5;
  long lVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  byte local_e19;
  byte local_db2;
  byte local_d1a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_be8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a40;
  bool local_a02;
  bool local_a01;
  string local_9e8;
  basic_string_view<char,_std::char_traits<char>_> local_9c8;
  basic_string_view<char,_std::char_traits<char>_> local_9b8;
  byte local_9a1;
  string local_9a0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_980;
  basic_string_view<char,_std::char_traits<char>_> local_970;
  basic_string_view<char,_std::char_traits<char>_> local_960;
  string local_950;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_930;
  string local_920;
  cmValue local_900;
  cmValue msvcDebugInformationFormatOptions;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  msvcDebugInformationFormat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  byte local_84a;
  byte local_849;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  cmValue local_768;
  cmValue watcomRuntimeLibraryOptions;
  string local_740;
  undefined1 local_720 [8];
  string watcomRuntimeLibrary;
  string local_6f8;
  cmValue local_6d8;
  cmValue watcomRuntimeLibraryValue;
  allocator<char> local_6c1;
  string local_6c0;
  cmValue local_6a0;
  cmValue watcomRuntimeLibraryDefault;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  byte local_612;
  byte local_611;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  cmValue local_530;
  cmValue msvcRuntimeLibraryOptions;
  string local_508;
  undefined1 local_4e8 [8];
  string msvcRuntimeLibrary;
  string local_4c0;
  cmValue local_4a0;
  cmValue msvcRuntimeLibraryValue;
  allocator<char> local_489;
  string local_488;
  cmValue local_468;
  cmValue msvcRuntimeLibraryDefault;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430 [32];
  iterator local_410;
  size_type local_408;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e5;
  undefined1 local_3e4;
  allocator<char> local_3e3;
  allocator<char> local_3e2;
  allocator<char> local_3e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  iterator local_358;
  size_type local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  allocator<char> local_329;
  string local_328;
  cmValue local_308;
  cmValue vfsOverlay;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  byte local_25b;
  byte local_25a;
  allocator<char> local_259;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  allocator<char> local_211;
  string local_210;
  cmValue local_1f0;
  allocator<char> local_1e1;
  string local_1e0;
  cmValue local_1c0;
  cmValue v;
  undefined1 local_198 [8];
  string compilerSimulateId;
  undefined1 local_158 [8];
  string compiler;
  string *i;
  iterator __end4;
  iterator __begin4;
  cmList *__range4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  iterator local_f0;
  size_type local_e8;
  undefined1 local_e0 [8];
  cmList optList;
  cmValue opt;
  string *optionFlagDef;
  cmStandardLevelResolver standardResolver;
  string local_88;
  string local_58;
  string *local_38;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *pcStack_20;
  cmBuildStep compileOrLink_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  local_38 = config;
  config_local = lang;
  lang_local._4_4_ = compileOrLink;
  pcStack_20 = target;
  target_local = (cmGeneratorTarget *)flags;
  flags_local = (string *)this;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[7]>
            (&local_58,(char (*) [7])0x11240fa,lang,(char (*) [7])0x110bf44);
  AddConfigVariableFlags(this,flags,&local_58,local_38);
  std::__cxx11::string::~string((string *)&local_58);
  standardResolver.Makefile._7_1_ = 0;
  local_a01 = true;
  if (lang_local._4_4_ != Compile) {
    local_a02 = false;
    if (lang_local._4_4_ == Link) {
      pcVar4 = this->Makefile;
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[35]>
                (&local_88,(char (*) [7])0x11240fa,config_local,
                 (char (*) [35])"_LINK_WITH_STANDARD_COMPILE_OPTION");
      standardResolver.Makefile._7_1_ = 1;
      local_a02 = cmMakefile::IsOn(pcVar4,&local_88);
    }
    local_a01 = local_a02;
  }
  if ((standardResolver.Makefile._7_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (local_a01 != false) {
    cmStandardLevelResolver::cmStandardLevelResolver
              ((cmStandardLevelResolver *)&optionFlagDef,this->Makefile);
    cmStandardLevelResolver::GetCompileOptionDef
              ((string *)&opt,(cmStandardLevelResolver *)&optionFlagDef,pcStack_20,config_local,
               local_38);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      pcVar4 = cmTarget::GetMakefile(pcStack_20->Target);
      optList.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)cmMakefile::GetDefinition(pcVar4,(string *)&opt);
      bVar2 = cmValue::operator_cast_to_bool
                        ((cmValue *)
                         &optList.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        psVar5 = cmValue::operator*[abi_cxx11_
                           ((cmValue *)
                            &optList.Values.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::string((string *)&local_110,(string *)psVar5);
        local_f0 = &local_110;
        local_e8 = 1;
        init._M_len = 1;
        init._M_array = local_f0;
        cmList::cmList((cmList *)local_e0,init);
        local_a40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0;
        do {
          local_a40 = local_a40 + -1;
          std::__cxx11::string::~string((string *)local_a40);
        } while (local_a40 != &local_110);
        __end4 = cmList::begin_abi_cxx11_((cmList *)local_e0);
        i = (string *)cmList::end_abi_cxx11_((cmList *)local_e0);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&i), bVar2) {
          compiler.field_2._8_8_ =
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end4);
          (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[9])
                    (this,target_local,compiler.field_2._8_8_);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end4);
        }
        cmList::~cmList((cmList *)local_e0);
      }
    }
    std::__cxx11::string::~string((string *)&opt);
  }
  pcVar4 = this->Makefile;
  psVar5 = (string *)((long)&compilerSimulateId.field_2 + 8);
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
            (psVar5,(char (*) [7])0x11240fa,config_local,(char (*) [13])0x11292b5);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar4,psVar5);
  std::__cxx11::string::string((string *)local_158,(string *)psVar5);
  std::__cxx11::string::~string((string *)(compilerSimulateId.field_2._M_local_buf + 8));
  pcVar4 = this->Makefile;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
            ((string *)&v,(char (*) [7])0x11240fa,config_local,(char (*) [13])0x1119efd);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar4,(string *)&v);
  std::__cxx11::string::string((string *)local_198,(string *)psVar5);
  std::__cxx11::string::~string((string *)&v);
  bVar2 = std::operator==(config_local,"Swift");
  pcVar1 = pcStack_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"Swift_LANGUAGE_VERSION",&local_1e1);
    local_1c0 = cmGeneratorTarget::GetProperty(pcVar1,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    bVar2 = cmValue::operator_cast_to_bool(&local_1c0);
    if (bVar2) {
      pcVar4 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"CMAKE_Swift_COMPILER_VERSION",&local_211);
      local_1f0 = cmMakefile::GetDefinition(pcVar4,&local_210);
      psVar5 = cmValue::operator_cast_to_string_(&local_1f0);
      bVar2 = cmSystemTools::VersionCompare(OP_GREATER_EQUAL,psVar5,"4.2");
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator(&local_211);
      pcVar1 = target_local;
      if (bVar2) {
        psVar5 = cmValue::operator*[abi_cxx11_(&local_1c0);
        std::operator+(&local_238,"-swift-version ",psVar5);
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,pcVar1,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
      }
    }
  }
  else {
    bVar2 = std::operator==(config_local,"CUDA");
    if (bVar2) {
      cmGeneratorTarget::AddCUDAArchitectureFlags
                (pcStack_20,lang_local._4_4_,local_38,(string *)target_local);
      cmGeneratorTarget::AddCUDAToolkitFlags(pcStack_20,(string *)target_local);
    }
    else {
      bVar2 = std::operator==(config_local,"ISPC");
      if (bVar2) {
        cmGeneratorTarget::AddISPCTargetFlags(pcStack_20,(string *)target_local);
      }
      else {
        local_25a = 0;
        local_25b = 0;
        bVar3 = std::operator==(config_local,"RC");
        bVar2 = false;
        if (bVar3) {
          pcVar4 = this->Makefile;
          std::allocator<char>::allocator();
          local_25a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_258,"CMAKE_RC_COMPILER",&local_259);
          local_25b = 1;
          psVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_258);
          lVar6 = std::__cxx11::string::find((char *)psVar5,0x1119eda);
          bVar2 = lVar6 != -1;
        }
        if ((local_25b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_258);
        }
        if ((local_25a & 1) != 0) {
          std::allocator<char>::~allocator(&local_259);
        }
        if (bVar2) {
          pcVar4 = this->Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_280,"CMAKE_C_COMPILER_ID",&local_281);
          psVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_280);
          std::__cxx11::string::operator=((string *)local_158,(string *)psVar5);
          std::__cxx11::string::~string((string *)&local_280);
          std::allocator<char>::~allocator(&local_281);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            pcVar4 = this->Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2a8,"CMAKE_C_SIMULATE_ID",&local_2a9);
            psVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_2a8);
            std::__cxx11::string::operator=((string *)local_198,(string *)psVar5);
            std::__cxx11::string::~string((string *)&local_2a8);
            std::allocator<char>::~allocator(&local_2a9);
          }
          else {
            pcVar4 = this->Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2d0,"CMAKE_CXX_COMPILER_ID",&local_2d1);
            psVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_2d0);
            std::__cxx11::string::operator=((string *)local_158,(string *)psVar5);
            std::__cxx11::string::~string((string *)&local_2d0);
            std::allocator<char>::~allocator(&local_2d1);
            pcVar4 = this->Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2f8,"CMAKE_CXX_SIMULATE_ID",
                       (allocator<char> *)((long)&vfsOverlay.Value + 7));
            psVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_2f8);
            std::__cxx11::string::operator=((string *)local_198,(string *)psVar5);
            std::__cxx11::string::~string((string *)&local_2f8);
            std::allocator<char>::~allocator((allocator<char> *)((long)&vfsOverlay.Value + 7));
          }
        }
        else {
          bVar2 = std::operator==(config_local,"HIP");
          if (bVar2) {
            cmGeneratorTarget::AddHIPArchitectureFlags
                      (pcStack_20,lang_local._4_4_,local_38,(string *)target_local);
          }
        }
      }
    }
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_158,"Clang");
  if (bVar2) {
    pcVar4 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"CMAKE_CLANG_VFS_OVERLAY",&local_329);
    local_308 = cmMakefile::GetDefinition(pcVar4,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator(&local_329);
    bVar2 = cmValue::operator_cast_to_bool(&local_308);
    if (bVar2) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_198,"MSVC");
      pcVar1 = target_local;
      if (bVar2) {
        local_3e4 = 1;
        local_3e0 = &local_3d8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d8,"-Xclang",&local_3e1);
        local_3e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_3b8,"-ivfsoverlay",&local_3e2);
        local_3e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_398,"-Xclang",&local_3e3);
        local_3e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378;
        psVar5 = cmValue::operator*[abi_cxx11_(&local_308);
        std::__cxx11::string::string(local_378,(string *)psVar5);
        local_3e4 = 0;
        local_358 = &local_3d8;
        local_350 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_3e5);
        __l_00._M_len = local_350;
        __l_00._M_array = local_358;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_348,__l_00,&local_3e5);
        AppendCompileOptions(this,(string *)pcVar1,&local_348,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_348);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_3e5);
        local_be8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_358;
        do {
          local_be8 = local_be8 + -1;
          std::__cxx11::string::~string((string *)local_be8);
        } while (local_be8 != &local_3d8);
        std::allocator<char>::~allocator(&local_3e3);
        std::allocator<char>::~allocator(&local_3e2);
        std::allocator<char>::~allocator(&local_3e1);
      }
      else {
        msvcRuntimeLibraryDefault.Value._6_1_ = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_450,"-ivfsoverlay",
                   (allocator<char> *)((long)&msvcRuntimeLibraryDefault.Value + 7));
        psVar5 = cmValue::operator*[abi_cxx11_(&local_308);
        std::__cxx11::string::string(local_430,(string *)psVar5);
        msvcRuntimeLibraryDefault.Value._6_1_ = 0;
        local_410 = &local_450;
        local_408 = 2;
        this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&msvcRuntimeLibraryDefault.Value + 5);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(this_00);
        __l._M_len = local_408;
        __l._M_array = local_410;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_400,__l,this_00);
        AppendCompileOptions(this,(string *)pcVar1,&local_400,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_400);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&msvcRuntimeLibraryDefault.Value + 5));
        local_c50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_410;
        do {
          local_c50 = local_c50 + -1;
          std::__cxx11::string::~string((string *)local_c50);
        } while (local_c50 != &local_450);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&msvcRuntimeLibraryDefault.Value + 7));
      }
    }
  }
  pcVar4 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT",&local_489);
  local_468 = cmMakefile::GetDefinition(pcVar4,&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  msvcRuntimeLibraryValue.Value = local_468.Value;
  bVar2 = cmNonempty(local_468);
  pcVar1 = pcStack_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,"MSVC_RUNTIME_LIBRARY",
               (allocator<char> *)(msvcRuntimeLibrary.field_2._M_local_buf + 0xf));
    local_4a0 = cmGeneratorTarget::GetProperty(pcVar1,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)(msvcRuntimeLibrary.field_2._M_local_buf + 0xf));
    bVar2 = cmValue::operator_cast_to_bool(&local_4a0);
    if (!bVar2) {
      local_4a0.Value = local_468.Value;
    }
    psVar5 = cmValue::operator*[abi_cxx11_(&local_4a0);
    std::__cxx11::string::string((string *)&local_508,(string *)psVar5);
    pcVar1 = pcStack_20;
    psVar5 = local_38;
    std::__cxx11::string::string((string *)&msvcRuntimeLibraryOptions);
    cmGeneratorExpression::Evaluate
              ((string *)local_4e8,&local_508,this,psVar5,pcVar1,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
               (string *)&msvcRuntimeLibraryOptions);
    std::__cxx11::string::~string((string *)&msvcRuntimeLibraryOptions);
    std::__cxx11::string::~string((string *)&local_508);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      pcVar4 = this->Makefile;
      std::operator+(&local_590,"CMAKE_",config_local);
      std::operator+(&local_570,&local_590,"_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_");
      std::operator+(&local_550,&local_570,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8)
      ;
      local_530 = cmMakefile::GetDefinition(pcVar4,&local_550);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_590);
      bVar2 = cmValue::operator_cast_to_bool(&local_530);
      pcVar1 = target_local;
      if (bVar2) {
        psVar5 = cmValue::operator*[abi_cxx11_(&local_530);
        AppendCompileOptions(this,(string *)pcVar1,psVar5,(char *)0x0);
      }
      else {
        pcVar4 = this->Makefile;
        local_611 = 0;
        local_612 = 0;
        std::operator+(&local_5d0,"CMAKE_",config_local);
        std::operator+(&local_5b0,&local_5d0,"_COMPILER_ID");
        psVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_5b0);
        bVar2 = std::operator==(psVar5,"MSVC");
        if (bVar2) {
LAB_00457a20:
          bVar2 = cmSystemTools::GetErrorOccurredFlag();
          local_d1a = bVar2 ^ 0xff;
        }
        else {
          pcVar4 = this->Makefile;
          std::operator+(&local_610,"CMAKE_",config_local);
          local_611 = 1;
          std::operator+(&local_5f0,&local_610,"_SIMULATE_ID");
          local_612 = 1;
          psVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_5f0);
          bVar2 = std::operator==(psVar5,"MSVC");
          local_d1a = 0;
          if (bVar2) goto LAB_00457a20;
        }
        if ((local_612 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_5f0);
        }
        if ((local_611 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_610);
        }
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)&local_5d0);
        if ((local_d1a & 1) != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &watcomRuntimeLibraryDefault,"MSVC_RUNTIME_LIBRARY value \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4e8);
          std::operator+(&local_678,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &watcomRuntimeLibraryDefault,"\' not known for this ");
          std::operator+(&local_658,&local_678,config_local);
          std::operator+(&local_638,&local_658," compiler.");
          IssueMessage(this,FATAL_ERROR,&local_638);
          std::__cxx11::string::~string((string *)&local_638);
          std::__cxx11::string::~string((string *)&local_658);
          std::__cxx11::string::~string((string *)&local_678);
          std::__cxx11::string::~string((string *)&watcomRuntimeLibraryDefault);
        }
      }
    }
    std::__cxx11::string::~string((string *)local_4e8);
  }
  pcVar4 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c0,"CMAKE_WATCOM_RUNTIME_LIBRARY_DEFAULT",&local_6c1);
  local_6a0 = cmMakefile::GetDefinition(pcVar4,&local_6c0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  watcomRuntimeLibraryValue.Value = local_6a0.Value;
  bVar2 = cmNonempty(local_6a0);
  pcVar1 = pcStack_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6f8,"WATCOM_RUNTIME_LIBRARY",
               (allocator<char> *)(watcomRuntimeLibrary.field_2._M_local_buf + 0xf));
    local_6d8 = cmGeneratorTarget::GetProperty(pcVar1,&local_6f8);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(watcomRuntimeLibrary.field_2._M_local_buf + 0xf));
    bVar2 = cmValue::operator_cast_to_bool(&local_6d8);
    if (!bVar2) {
      local_6d8.Value = local_6a0.Value;
    }
    psVar5 = cmValue::operator*[abi_cxx11_(&local_6d8);
    std::__cxx11::string::string((string *)&local_740,(string *)psVar5);
    pcVar1 = pcStack_20;
    psVar5 = local_38;
    std::__cxx11::string::string((string *)&watcomRuntimeLibraryOptions);
    cmGeneratorExpression::Evaluate
              ((string *)local_720,&local_740,this,psVar5,pcVar1,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
               (string *)&watcomRuntimeLibraryOptions);
    std::__cxx11::string::~string((string *)&watcomRuntimeLibraryOptions);
    std::__cxx11::string::~string((string *)&local_740);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      pcVar4 = this->Makefile;
      std::operator+(&local_7c8,"CMAKE_",config_local);
      std::operator+(&local_7a8,&local_7c8,"_COMPILE_OPTIONS_WATCOM_RUNTIME_LIBRARY_");
      std::operator+(&local_788,&local_7a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720)
      ;
      local_768 = cmMakefile::GetDefinition(pcVar4,&local_788);
      std::__cxx11::string::~string((string *)&local_788);
      std::__cxx11::string::~string((string *)&local_7a8);
      std::__cxx11::string::~string((string *)&local_7c8);
      bVar2 = cmValue::operator_cast_to_bool(&local_768);
      pcVar1 = target_local;
      if (bVar2) {
        psVar5 = cmValue::operator*[abi_cxx11_(&local_768);
        AppendCompileOptions(this,(string *)pcVar1,psVar5,(char *)0x0);
      }
      else {
        pcVar4 = this->Makefile;
        local_849 = 0;
        local_84a = 0;
        std::operator+(&local_808,"CMAKE_",config_local);
        std::operator+(&local_7e8,&local_808,"_COMPILER_ID");
        psVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_7e8);
        bVar2 = std::operator==(psVar5,"OpenWatcom");
        if (bVar2) {
LAB_0045819f:
          bVar2 = cmSystemTools::GetErrorOccurredFlag();
          local_db2 = bVar2 ^ 0xff;
        }
        else {
          pcVar4 = this->Makefile;
          std::operator+(&local_848,"CMAKE_",config_local);
          local_849 = 1;
          std::operator+(&local_828,&local_848,"_SIMULATE_ID");
          local_84a = 1;
          psVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_828);
          bVar2 = std::operator==(psVar5,"OpenWatcom");
          local_db2 = 0;
          if (bVar2) goto LAB_0045819f;
        }
        if ((local_84a & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_828);
        }
        if ((local_849 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_848);
        }
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_808);
        if ((local_db2 & 1) != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &msvcDebugInformationFormat.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_engaged,"WATCOM_RUNTIME_LIBRARY value \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_720);
          std::operator+(&local_8b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &msvcDebugInformationFormat.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_engaged,"\' not known for this ");
          std::operator+(&local_890,&local_8b0,config_local);
          std::operator+(&local_870,&local_890," compiler.");
          IssueMessage(this,FATAL_ERROR,&local_870);
          std::__cxx11::string::~string((string *)&local_870);
          std::__cxx11::string::~string((string *)&local_890);
          std::__cxx11::string::~string((string *)&local_8b0);
          std::__cxx11::string::~string
                    ((string *)
                     &msvcDebugInformationFormat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_engaged);
        }
      }
    }
    std::__cxx11::string::~string((string *)local_720);
  }
  GetMSVCDebugFormatName
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&msvcDebugInformationFormatOptions,this,local_38,pcStack_20);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&msvcDebugInformationFormatOptions);
  if (!bVar2) goto LAB_00458832;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&msvcDebugInformationFormatOptions);
  uVar7 = std::__cxx11::string::empty();
  psVar5 = config_local;
  if ((uVar7 & 1) != 0) goto LAB_00458832;
  pcVar4 = this->Makefile;
  pbVar8 = std::
           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&msvcDebugInformationFormatOptions);
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[48],std::__cxx11::string&>
            (&local_920,(char (*) [7])0x11240fa,psVar5,
             (char (*) [48])"_COMPILE_OPTIONS_MSVC_DEBUG_INFORMATION_FORMAT_",pbVar8);
  local_900 = cmMakefile::GetDefinition(pcVar4,&local_920);
  std::__cxx11::string::~string((string *)&local_920);
  bVar2 = cmValue::operator_cast_to_bool(&local_900);
  pcVar1 = target_local;
  if (bVar2) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_900);
    AppendCompileOptions(this,(string *)pcVar1,psVar5,(char *)0x0);
    goto LAB_00458832;
  }
  pcVar4 = this->Makefile;
  local_9a1 = 0;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
            (&local_950,(char (*) [7])0x11240fa,config_local,(char (*) [13])0x11292b5);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_950);
  local_930 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
  local_970 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("MSVC",4);
  local_960 = local_970;
  bVar2 = std::operator==(local_930,local_970);
  if (bVar2) {
LAB_0045871a:
    bVar2 = cmSystemTools::GetErrorOccurredFlag();
    local_e19 = bVar2 ^ 0xff;
  }
  else {
    pcVar4 = this->Makefile;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
              (&local_9a0,(char (*) [7])0x11240fa,config_local,(char (*) [13])0x1119efd);
    local_9a1 = 1;
    psVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_9a0);
    local_980 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    local_9c8 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("MSVC",4);
    local_9b8 = local_9c8;
    bVar2 = std::operator==(local_980,local_9c8);
    local_e19 = 0;
    if (bVar2) goto LAB_0045871a;
  }
  if ((local_9a1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_9a0);
  }
  std::__cxx11::string::~string((string *)&local_950);
  if ((local_e19 & 1) != 0) {
    pbVar8 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&msvcDebugInformationFormatOptions);
    cmStrCat<char_const(&)[38],std::__cxx11::string&,char_const(&)[22],std::__cxx11::string_const&,char_const(&)[11]>
              (&local_9e8,(char (*) [38])"MSVC_DEBUG_INFORMATION_FORMAT value \'",pbVar8,
               (char (*) [22])"\' not known for this ",config_local,(char (*) [11])0x11240eb);
    IssueMessage(this,FATAL_ERROR,&local_9e8);
    std::__cxx11::string::~string((string *)&local_9e8);
  }
LAB_00458832:
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&msvcDebugInformationFormatOptions);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)local_158);
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlags(std::string& flags,
                                        cmGeneratorTarget const* target,
                                        cmBuildStep compileOrLink,
                                        const std::string& lang,
                                        const std::string& config)
{
  // Add language-specific flags.
  this->AddConfigVariableFlags(flags, cmStrCat("CMAKE_", lang, "_FLAGS"),
                               config);

  // Add the language standard flag for compiling, and sometimes linking.
  if (compileOrLink == cmBuildStep::Compile ||
      (compileOrLink == cmBuildStep::Link &&
       // Some toolchains require use of the language standard flag
       // when linking in order to use the matching standard library.
       // FIXME: If CMake gains an abstraction for standard library
       // selection, this will have to be reconciled with it.
       this->Makefile->IsOn(
         cmStrCat("CMAKE_", lang, "_LINK_WITH_STANDARD_COMPILE_OPTION")))) {
    cmStandardLevelResolver standardResolver(this->Makefile);
    std::string const& optionFlagDef =
      standardResolver.GetCompileOptionDef(target, lang, config);
    if (!optionFlagDef.empty()) {
      cmValue opt =
        target->Target->GetMakefile()->GetDefinition(optionFlagDef);
      if (opt) {
        cmList optList{ *opt };
        for (std::string const& i : optList) {
          this->AppendFlagEscape(flags, i);
        }
      }
    }
  }

  std::string compiler = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));

  std::string compilerSimulateId = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_SIMULATE_ID"));

  if (lang == "Swift") {
    if (cmValue v = target->GetProperty("Swift_LANGUAGE_VERSION")) {
      if (cmSystemTools::VersionCompare(
            cmSystemTools::OP_GREATER_EQUAL,
            this->Makefile->GetDefinition("CMAKE_Swift_COMPILER_VERSION"),
            "4.2")) {
        this->AppendFlags(flags, "-swift-version " + *v);
      }
    }
  } else if (lang == "CUDA") {
    target->AddCUDAArchitectureFlags(compileOrLink, config, flags);
    target->AddCUDAToolkitFlags(flags);
  } else if (lang == "ISPC") {
    target->AddISPCTargetFlags(flags);
  } else if (lang == "RC" &&
             this->Makefile->GetSafeDefinition("CMAKE_RC_COMPILER")
                 .find("llvm-rc") != std::string::npos) {
    compiler = this->Makefile->GetSafeDefinition("CMAKE_C_COMPILER_ID");
    if (!compiler.empty()) {
      compilerSimulateId =
        this->Makefile->GetSafeDefinition("CMAKE_C_SIMULATE_ID");
    } else {
      compiler = this->Makefile->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
      compilerSimulateId =
        this->Makefile->GetSafeDefinition("CMAKE_CXX_SIMULATE_ID");
    }
  } else if (lang == "HIP") {
    target->AddHIPArchitectureFlags(compileOrLink, config, flags);
  }

  // Add VFS Overlay for Clang compilers
  if (compiler == "Clang") {
    if (cmValue vfsOverlay =
          this->Makefile->GetDefinition("CMAKE_CLANG_VFS_OVERLAY")) {
      if (compilerSimulateId == "MSVC") {
        this->AppendCompileOptions(
          flags,
          std::vector<std::string>{ "-Xclang", "-ivfsoverlay", "-Xclang",
                                    *vfsOverlay });
      } else {
        this->AppendCompileOptions(
          flags, std::vector<std::string>{ "-ivfsoverlay", *vfsOverlay });
      }
    }
  }
  // Add MSVC runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  cmValue msvcRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT");
  if (cmNonempty(msvcRuntimeLibraryDefault)) {
    cmValue msvcRuntimeLibraryValue =
      target->GetProperty("MSVC_RUNTIME_LIBRARY");
    if (!msvcRuntimeLibraryValue) {
      msvcRuntimeLibraryValue = msvcRuntimeLibraryDefault;
    }
    std::string const msvcRuntimeLibrary = cmGeneratorExpression::Evaluate(
      *msvcRuntimeLibraryValue, this, config, target);
    if (!msvcRuntimeLibrary.empty()) {
      if (cmValue msvcRuntimeLibraryOptions = this->Makefile->GetDefinition(
            "CMAKE_" + lang + "_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_" +
            msvcRuntimeLibrary)) {
        this->AppendCompileOptions(flags, *msvcRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "MSVC" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "MSVC") &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "MSVC_RUNTIME_LIBRARY value '" +
                             msvcRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }

  // Add Watcom runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  cmValue watcomRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_WATCOM_RUNTIME_LIBRARY_DEFAULT");
  if (cmNonempty(watcomRuntimeLibraryDefault)) {
    cmValue watcomRuntimeLibraryValue =
      target->GetProperty("WATCOM_RUNTIME_LIBRARY");
    if (!watcomRuntimeLibraryValue) {
      watcomRuntimeLibraryValue = watcomRuntimeLibraryDefault;
    }
    std::string const watcomRuntimeLibrary = cmGeneratorExpression::Evaluate(
      *watcomRuntimeLibraryValue, this, config, target);
    if (!watcomRuntimeLibrary.empty()) {
      if (cmValue watcomRuntimeLibraryOptions = this->Makefile->GetDefinition(
            "CMAKE_" + lang + "_COMPILE_OPTIONS_WATCOM_RUNTIME_LIBRARY_" +
            watcomRuntimeLibrary)) {
        this->AppendCompileOptions(flags, *watcomRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "OpenWatcom" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "OpenWatcom") &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the Watcom ABI so it needs a known runtime
        // library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "WATCOM_RUNTIME_LIBRARY value '" +
                             watcomRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }

  // Add MSVC debug information format flags if CMP0141 is NEW.
  if (cm::optional<std::string> msvcDebugInformationFormat =
        this->GetMSVCDebugFormatName(config, target)) {
    if (!msvcDebugInformationFormat->empty()) {
      if (cmValue msvcDebugInformationFormatOptions =
            this->Makefile->GetDefinition(
              cmStrCat("CMAKE_", lang,
                       "_COMPILE_OPTIONS_MSVC_DEBUG_INFORMATION_FORMAT_",
                       *msvcDebugInformationFormat))) {
        this->AppendCompileOptions(flags, *msvcDebugInformationFormatOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_COMPILER_ID")) == "MSVC"_s ||
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_SIMULATE_ID")) == "MSVC"_s) &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           cmStrCat("MSVC_DEBUG_INFORMATION_FORMAT value '",
                                    *msvcDebugInformationFormat,
                                    "' not known for this ", lang,
                                    " compiler."));
      }
    }
  }
}